

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-dump-file.cpp
# Opt level: O2

bool readBool(FILE *stream,uint8_t *value)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  uint8_t v;
  fpos_t pos;
  
  *value = '\0';
  iVar1 = fgetpos((FILE *)stream,(fpos_t *)&pos);
  if (iVar1 == 0) {
    sVar2 = fread(&v,1,1,(FILE *)stream);
    bVar3 = sVar2 == 1;
    if (bVar3) {
      *value = v;
    }
    else {
      fsetpos((FILE *)stream,(fpos_t *)&pos);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool readBool(FILE* stream, uint8_t& value)
{
	value = 0;
	fpos_t pos;
	if (fgetpos(stream, &pos) != 0)
	{
		return false;
	}
	uint8_t v;
	if (fread(&v, 1, 1, stream) != 1)
	{
		(void) fsetpos(stream, &pos);
		return false;
	}
	value = v;
	return true;
}